

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O3

void __thiscall EVPExtraTest_DigestSignInit_Test::TestBody(EVPExtraTest_DigestSignInit_Test *this)

{
  int iVar1;
  EVP_MD *pEVar2;
  AssertHelper *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  size_t sig_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  UniquePtr<EVP_PKEY> pkey;
  ScopedEVP_MD_CTX md_ctx;
  AssertHelper local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  AssertHelper local_90;
  AssertHelper local_88;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  pointer local_48;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_38;
  undefined1 local_30 [16];
  undefined8 local_20;
  
  LoadExampleRSAKey();
  local_78[0] = (internal)((EVP_PKEY *)local_38._M_head_impl != (EVP_PKEY *)0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_38._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_30,(internal *)local_78,(AssertionResult *)0x583608,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x17b,(char *)local_30._0_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((EVP_MD *)local_30._0_8_ != (EVP_MD *)&stack0xffffffffffffffe0) {
      operator_delete((void *)local_30._0_8_,(ulong)(local_20 + 1));
    }
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    goto LAB_00276306;
  }
  EVP_MD_CTX_init((EVP_MD_CTX *)local_30);
  pEVar2 = EVP_sha256();
  iVar1 = EVP_DigestSignInit((EVP_MD_CTX *)local_30,(EVP_PKEY_CTX **)0x0,pEVar2,(ENGINE *)0x0,
                             (EVP_PKEY *)local_38._M_head_impl);
  local_58[0] = iVar1 != 0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_58,
               (AssertionResult *)
               "EVP_DigestSignInit(md_ctx.get(), __null, EVP_sha256(), __null, pkey.get())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x17e,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a0);
LAB_00275efe:
    this_00 = &local_80;
LAB_00275f03:
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_a0.data_._1_7_,local_a0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a0.data_._1_7_,local_a0.data_._0_1_) + 8))();
    }
    if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_50,pbStack_50);
    }
  }
  else {
    iVar1 = EVP_DigestSignUpdate((EVP_MD_CTX *)local_30,"\x01\x02\x03\x04",4);
    local_58[0] = iVar1 != 0;
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_58,
                 (AssertionResult *)"EVP_DigestSignUpdate(md_ctx.get(), kMsg, sizeof(kMsg))","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x17f,(char *)CONCAT71(local_78._1_7_,local_78[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a0);
      goto LAB_00275efe;
    }
    local_80.data_ = (AssertHelperData *)0x0;
    iVar1 = EVP_DigestSignFinal((EVP_MD_CTX *)local_30,(uchar *)0x0,(size_t *)&local_80);
    local_58[0] = iVar1 != 0;
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_58,
                 (AssertionResult *)"EVP_DigestSignFinal(md_ctx.get(), __null, &sig_len)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x183,(char *)CONCAT71(local_78._1_7_,local_78[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
      this_00 = &local_90;
      goto LAB_00275f03;
    }
    iVar1 = EVP_PKEY_size((EVP_PKEY *)local_38._M_head_impl);
    local_58 = (undefined1  [8])(long)iVar1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_78,"static_cast<size_t>(EVP_PKEY_size(pkey.get()))","sig_len",
               (unsigned_long *)local_58,(unsigned_long *)&local_80);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_58);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x186,message);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_58 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_58 + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    local_58 = (undefined1  [8])0x0;
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
               (size_type)local_80.data_);
    iVar1 = EVP_DigestSignFinal((EVP_MD_CTX *)local_30,(uchar *)local_58,(size_t *)&local_80);
    local_a0.data_._0_1_ = (internal)(iVar1 != 0);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_a0,
                 (AssertionResult *)"EVP_DigestSignFinal(md_ctx.get(), sig.data(), &sig_len)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x18a,(char *)CONCAT71(local_78._1_7_,local_78[0]));
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
LAB_0027629e:
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
      }
      if (local_90.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                 (size_type)local_80.data_);
      EVP_MD_CTX_cleanup((EVP_MD_CTX *)local_30);
      EVP_MD_CTX_init((EVP_MD_CTX *)local_30);
      pEVar2 = EVP_sha256();
      iVar1 = EVP_DigestVerifyInit
                        ((EVP_MD_CTX *)local_30,(EVP_PKEY_CTX **)0x0,pEVar2,(ENGINE *)0x0,
                         (EVP_PKEY *)local_38._M_head_impl);
      local_a0.data_._0_1_ = (internal)(iVar1 != 0);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_a0,
                   (AssertionResult *)
                   "EVP_DigestVerifyInit(md_ctx.get(), __null, EVP_sha256(), __null, pkey.get())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,400,(char *)CONCAT71(local_78._1_7_,local_78[0]));
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        goto LAB_0027629e;
      }
      iVar1 = EVP_DigestVerifyUpdate((EVP_MD_CTX *)local_30,"\x01\x02\x03\x04",4);
      local_a0.data_._0_1_ = (internal)(iVar1 != 0);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_a0,
                   (AssertionResult *)"EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x191,(char *)CONCAT71(local_78._1_7_,local_78[0]));
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        goto LAB_0027629e;
      }
      iVar1 = EVP_DigestVerifyFinal((EVP_MD_CTX *)local_30,(uchar *)local_58,(size_t)local_80.data_)
      ;
      local_a0.data_._0_1_ = (internal)(iVar1 != 0);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_a0.data_._0_1_) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_a0,
                   (AssertionResult *)"EVP_DigestVerifyFinal(md_ctx.get(), sig.data(), sig_len)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x192,(char *)CONCAT71(local_78._1_7_,local_78[0]));
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        goto LAB_0027629e;
      }
    }
    if (local_58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_58,(long)local_48 - (long)local_58);
    }
  }
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)local_30);
LAB_00276306:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST(EVPExtraTest, DigestSignInit) {
  bssl::UniquePtr<EVP_PKEY> pkey = LoadExampleRSAKey();
  ASSERT_TRUE(pkey);
  bssl::ScopedEVP_MD_CTX md_ctx;
  ASSERT_TRUE(
      EVP_DigestSignInit(md_ctx.get(), NULL, EVP_sha256(), NULL, pkey.get()));
  ASSERT_TRUE(EVP_DigestSignUpdate(md_ctx.get(), kMsg, sizeof(kMsg)));

  // Determine the size of the signature.
  size_t sig_len = 0;
  ASSERT_TRUE(EVP_DigestSignFinal(md_ctx.get(), NULL, &sig_len));

  // Sanity check for testing.
  EXPECT_EQ(static_cast<size_t>(EVP_PKEY_size(pkey.get())), sig_len);

  std::vector<uint8_t> sig;
  sig.resize(sig_len);
  ASSERT_TRUE(EVP_DigestSignFinal(md_ctx.get(), sig.data(), &sig_len));
  sig.resize(sig_len);

  // Ensure that the signature round-trips.
  md_ctx.Reset();
  ASSERT_TRUE(
      EVP_DigestVerifyInit(md_ctx.get(), NULL, EVP_sha256(), NULL, pkey.get()));
  ASSERT_TRUE(EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg)));
  ASSERT_TRUE(EVP_DigestVerifyFinal(md_ctx.get(), sig.data(), sig_len));
}